

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# devexpricing.hpp
# Opt level: O0

void __thiscall
DevexPricing::DevexPricing(DevexPricing *this,Runtime *rt,Basis *bas,ReducedCosts *rc)

{
  value_type_conflict1 *__value;
  _func_int **in_RCX;
  _func_int **in_RDX;
  _func_int **in_RSI;
  Pricing *in_RDI;
  allocator_type *__a;
  undefined1 *__n;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffffc0;
  undefined1 local_29;
  undefined8 local_28;
  _func_int **local_20;
  _func_int **local_18;
  _func_int **local_10;
  
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  Pricing::Pricing(in_RDI);
  in_RDI->_vptr_Pricing = (_func_int **)&PTR_price_0096e1c0;
  in_RDI[1]._vptr_Pricing = local_10;
  in_RDI[2]._vptr_Pricing = local_18;
  in_RDI[3]._vptr_Pricing = local_20;
  __a = (allocator_type *)(in_RDI + 4);
  __value = (value_type_conflict1 *)(long)*(int *)((long)local_10 + 4);
  local_28 = 0x3ff0000000000000;
  __n = &local_29;
  std::allocator<double>::allocator((allocator<double> *)0x76034a);
  std::vector<double,_std::allocator<double>_>::vector
            (in_stack_ffffffffffffffc0,(size_type)__n,__value,__a);
  std::allocator<double>::~allocator((allocator<double> *)0x76036f);
  return;
}

Assistant:

DevexPricing(Runtime& rt, Basis& bas, ReducedCosts& rc)
      : runtime(rt),
        basis(bas),
        redcosts(rc),
        // clang-format off
        weights(std::vector<double>(rt.instance.num_var, 1.0)) {}